

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

xmlNodePtr xmlStaticCopyNodeList(xmlNodePtr node,xmlDocPtr doc,xmlNodePtr parent)

{
  xmlDtdPtr cur;
  xmlDtdPtr cur_00;
  xmlDtdPtr dtd;
  xmlDtdPtr pxVar1;
  
  if (node != (xmlNodePtr)0x0) {
    pxVar1 = (xmlDtdPtr)0x0;
    cur_00 = (xmlDtdPtr)0x0;
    dtd = (xmlDtdPtr)node;
    while( true ) {
      while (((xmlDtdPtr)node)->type == XML_DTD_NODE) {
        if (doc != (xmlDocPtr)0x0) {
          cur = doc->intSubset;
          if (cur == (xmlDtdPtr)0x0) {
            cur = xmlCopyDtd(dtd);
            if (cur == (xmlDtdPtr)0x0) goto LAB_00184b74;
            cur->doc = doc;
            cur->parent = (_xmlDoc *)parent;
            doc->intSubset = cur;
          }
          xmlAddChild(parent,(xmlNodePtr)cur);
          node = (xmlNodePtr)dtd;
          goto LAB_00184b48;
        }
        node = ((xmlDtdPtr)node)->next;
        if ((xmlDtdPtr)node == (xmlDtdPtr)0x0) {
          return (xmlNodePtr)cur_00;
        }
      }
      cur = (xmlDtdPtr)xmlStaticCopyNode(node,doc,parent,1);
      if (cur == (xmlDtdPtr)0x0) break;
LAB_00184b48:
      if (cur_00 == (xmlDtdPtr)0x0) {
        pxVar1 = (xmlDtdPtr)0x0;
        cur_00 = cur;
LAB_00184b5e:
        cur->prev = (_xmlNode *)pxVar1;
        pxVar1 = cur;
      }
      else if (pxVar1 != cur) {
        pxVar1->next = (_xmlNode *)cur;
        goto LAB_00184b5e;
      }
      node = ((xmlDtdPtr)node)->next;
      dtd = (xmlDtdPtr)node;
      if ((xmlDtdPtr)node == (xmlDtdPtr)0x0) {
        return (xmlNodePtr)cur_00;
      }
    }
LAB_00184b74:
    xmlFreeNodeList((xmlNodePtr)cur_00);
  }
  return (xmlNodePtr)0x0;
}

Assistant:

xmlNodePtr
xmlStaticCopyNodeList(xmlNodePtr node, xmlDocPtr doc, xmlNodePtr parent) {
    xmlNodePtr ret = NULL;
    xmlNodePtr p = NULL,q;

    while (node != NULL) {
#ifdef LIBXML_TREE_ENABLED
	if (node->type == XML_DTD_NODE ) {
	    if (doc == NULL) {
		node = node->next;
		continue;
	    }
	    if (doc->intSubset == NULL) {
		q = (xmlNodePtr) xmlCopyDtd( (xmlDtdPtr) node );
		if (q == NULL) goto error;
		q->doc = doc;
		q->parent = parent;
		doc->intSubset = (xmlDtdPtr) q;
		xmlAddChild(parent, q);
	    } else {
		q = (xmlNodePtr) doc->intSubset;
		xmlAddChild(parent, q);
	    }
	} else
#endif /* LIBXML_TREE_ENABLED */
	    q = xmlStaticCopyNode(node, doc, parent, 1);
	if (q == NULL) goto error;
	if (ret == NULL) {
	    q->prev = NULL;
	    ret = p = q;
	} else if (p != q) {
	/* the test is required if xmlStaticCopyNode coalesced 2 text nodes */
	    p->next = q;
	    q->prev = p;
	    p = q;
	}
	node = node->next;
    }
    return(ret);
error:
    xmlFreeNodeList(ret);
    return(NULL);
}